

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O2

RealType __thiscall OpenMD::Thermo::getPressure(Thermo *this)

{
  Snapshot *this_00;
  RealType RVar1;
  Mat3x3d tensor;
  RectMatrix<double,_3U,_3U> local_b0;
  RectMatrix<double,_3U,_3U> local_68;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasPressure == false) {
    SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)&local_68);
    getPressureTensor((Mat3x3d *)&local_b0,this);
    RectMatrix<double,_3U,_3U>::operator=(&local_68,&local_b0);
    Snapshot::setPressure
              (this_00,((local_68.data_[0][0] + local_68.data_[1][1] + local_68.data_[2][2]) *
                       163882576.0) / 3.0);
  }
  RVar1 = Snapshot::getPressure(this_00);
  return RVar1;
}

Assistant:

RealType Thermo::getPressure() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasPressure) {
      // Relies on the calculation of the full molecular pressure tensor

      Mat3x3d tensor;
      RealType pressure;

      tensor = getPressureTensor();

      pressure = Constants::pressureConvert *
                 (tensor(0, 0) + tensor(1, 1) + tensor(2, 2)) / 3.0;

      snap->setPressure(pressure);
    }

    return snap->getPressure();
  }